

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.cc
# Opt level: O2

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,Value *dst)

{
  vtable_type *pvVar1;
  bool bVar2;
  uint32_t tyid;
  difference_type __d_1;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  *pvVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pSVar6;
  pointer pSVar7;
  long lVar8;
  long lVar9;
  pointer pSVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  
  bVar2 = is_blocked(this);
  if (bVar2) goto LAB_00203094;
  if ((NAN(t)) && (bVar2 = has_value(this), bVar2)) {
LAB_002031b8:
    linb::any::operator=(&dst->v_,(any *)this);
    bVar2 = true;
  }
  else {
    if ((this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      bVar2 = has_value(this);
      if (bVar2) goto LAB_002031b8;
    }
    else {
      pvVar3 = tinyusdz::value::TimeSamples::get_samples(&this->_ts);
      pSVar10 = (pvVar3->
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pSVar6 = (pvVar3->
               super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pSVar10 != pSVar6) {
        if (NAN(t)) {
          if (pSVar10->blocked != false) goto LAB_00203094;
          this = (PrimVar *)&pSVar10->value;
        }
        else {
          if (tinterp != Held) {
            pvVar1 = (this->_value).v_.vtable;
            if (pvVar1 == (vtable_type *)0x0) {
              tyid = 2;
            }
            else {
              tyid = (*pvVar1->type_id)();
            }
            bVar2 = tinyusdz::value::IsLerpSupportedType(tyid);
            pSVar10 = (pvVar3->
                      super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pSVar6 = (pvVar3->
                     super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            if (bVar2) {
              uVar4 = ((long)pSVar6 - (long)pSVar10) / 0x28;
              pSVar6 = pSVar10;
              uVar5 = uVar4;
              while (uVar11 = uVar5, 0 < (long)uVar11) {
                uVar5 = uVar11 >> 1;
                if (pSVar6[uVar5].t <= t && t != pSVar6[uVar5].t) {
                  pSVar6 = pSVar6 + uVar5 + 1;
                  uVar5 = ~uVar5 + uVar11;
                }
              }
              pSVar7 = pSVar6 + -1;
              if (pSVar6 == pSVar10) {
                pSVar7 = pSVar10;
              }
              lVar9 = uVar4 - 1;
              lVar8 = ((long)pSVar7 - (long)pSVar10) / 0x28;
              if (lVar9 <= lVar8) {
                lVar8 = lVar9;
              }
              if (lVar8 < 1) {
                lVar8 = 0;
              }
              if (lVar8 + 1 < lVar9) {
                lVar9 = lVar8 + 1;
              }
              if (lVar9 < 1) {
                lVar9 = 0;
              }
              dVar13 = pSVar10[lVar8].t;
              dVar12 = pSVar10[lVar9].t - dVar13;
              dVar13 = (double)(~-(ulong)(ABS(dVar12) < 2.220446049250313e-16) &
                               (ulong)((t - dVar13) / dVar12));
              if (1.0 <= dVar13) {
                dVar13 = 1.0;
              }
              if (dVar13 <= 0.0) {
                dVar13 = 0.0;
              }
              bVar2 = tinyusdz::value::Lerp(&pSVar10[lVar8].value,&pSVar10[lVar9].value,dVar13,dst);
              return bVar2;
            }
          }
          uVar5 = ((long)pSVar6 - (long)pSVar10) / 0x28;
          pSVar6 = pSVar10;
          while (uVar4 = uVar5, 0 < (long)uVar4) {
            uVar5 = uVar4 >> 1;
            if (pSVar6[uVar5].t <= t) {
              pSVar6 = pSVar6 + uVar5 + 1;
              uVar5 = ~uVar5 + uVar4;
            }
          }
          pSVar7 = pSVar6 + -1;
          if (pSVar6 == pSVar10) {
            pSVar7 = pSVar10;
          }
          this = (PrimVar *)&pSVar7->value;
        }
        goto LAB_002031b8;
      }
    }
LAB_00203094:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool PrimVar::get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, value::Value *dst) const {

  if (is_blocked()) {
    return false;
  }

  if (value::TimeCode(t).is_default()) {
    if (has_default()) {
      (*dst) = _value;
      return true;
    }
  }

  if (has_timesamples()) {
    const std::vector<value::TimeSamples::Sample> &samples = _ts.get_samples();

    if (samples.empty()) {
      // ???
      return false;
    }

    if (value::TimeCode(t).is_default())  {
      // FIXME: Use the first item for now.
      if (samples[0].blocked) {
        return false;
      }

      (*dst) = samples[0].value;
      return true;
    } else {

      if (tinterp == value::TimeSampleInterpolationType::Held || !value::IsLerpSupportedType(_value.type_id())) {

        auto it = std::upper_bound(
          samples.begin(), samples.end(), t,
          [](double tval, const value::TimeSamples::Sample &a) { return tval < a.t; });

        const auto it_minus_1 = (it == samples.begin()) ? samples.begin() : (it - 1);

        (*dst) = it_minus_1->value;
        return true;

      } else { // Lerp 

        // TODO: Unify code in prim-types.hh
        auto it = std::lower_bound(
            samples.begin(), samples.end(), t,
            [](const value::TimeSamples::Sample &a, double tval) { return a.t < tval; });

        const auto it_minus_1 = (it == samples.begin()) ? samples.begin() : (it - 1);

        size_t idx0 = size_t(std::max(
            int64_t(0),
            std::min(int64_t(samples.size() - 1),
                     int64_t(std::distance(samples.begin(), it_minus_1)))));
        size_t idx1 =
            size_t(std::max(int64_t(0), std::min(int64_t(samples.size() - 1),
                                                 int64_t(idx0) + 1)));

        double tl = samples[idx0].t;
        double tu = samples[idx1].t;

        double dt = (t - tl);
        if (std::fabs(tu - tl) < std::numeric_limits<double>::epsilon()) {
          // slope is zero.
          dt = 0.0;
        } else {
          dt /= (tu - tl);
        }

        // Just in case.
        dt = std::max(0.0, std::min(1.0, dt));

        const value::Value &p0 = samples[idx0].value;
        const value::Value &p1 = samples[idx1].value;

        bool ret = value::Lerp(p0, p1, dt, dst);
        return ret;
      }
    }
  }

  if (has_default()) {
    (*dst) = _value;
    return true;
  }

  return false;
}